

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

SRes crnlib::LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  UInt16 *pUVar4;
  bool bVar5;
  CRangeEnc *p_00;
  UInt16 (*paUVar6) [16];
  UInt16 (*paUVar7) [64];
  byte bVar8;
  UInt32 UVar9;
  UInt32 UVar10;
  uint uVar11;
  SRes SVar12;
  undefined4 extraout_var;
  Byte *pBVar13;
  COptimal *pCVar14;
  undefined8 uVar15;
  UInt32 *pUVar16;
  uint uVar17;
  long lVar18;
  undefined1 *puVar19;
  COptimal *pCVar20;
  uint uVar21;
  CState *pCVar22;
  long lVar23;
  UInt32 m;
  ulong uVar24;
  ulong uVar25;
  CRangeEnc *pCVar26;
  int iVar27;
  uint uVar28;
  UInt32 *pUVar29;
  UInt32 (*paUVar30) [272];
  uint uVar31;
  ulong uVar32;
  char cVar33;
  long lVar34;
  UInt32 *in_R9;
  uint uVar35;
  UInt32 m_1;
  ulong uVar36;
  uint uVar37;
  UInt32 UVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  Byte *pBVar42;
  UInt32 m_2;
  uint uVar43;
  Byte *pBVar44;
  bool bVar45;
  bool bVar46;
  UInt32 numPairs;
  UInt32 numPairs_1;
  UInt32 repLens [4];
  ulong local_210;
  UInt32 local_208;
  uint local_204;
  ulong local_200;
  Byte *local_1f8;
  CRangeEnc *local_1f0;
  COptimal *local_1e8;
  UInt32 *local_1e0;
  UInt32 *local_1d8;
  UInt32 local_1cc;
  UInt32 *local_1c8;
  ulong local_1c0;
  UInt16 (*local_1b8) [16];
  uint local_1b0;
  UInt32 local_1ac;
  uint local_1a8;
  UInt32 UStack_1a4;
  UInt32 UStack_1a0;
  UInt32 UStack_19c;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  Byte *local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  int local_154;
  uint local_150;
  uint local_14c;
  UInt16 (*local_148) [16];
  ulong local_140;
  ulong local_138;
  COptimal *local_130;
  UInt32 (*local_128) [272];
  UInt32 (*local_120) [272];
  ulong local_118;
  ulong local_110;
  ulong local_108;
  uint local_100;
  uint local_fc;
  UInt32 local_f8;
  UInt32 local_f4;
  UInt32 local_f0;
  Bool local_ec;
  uint local_e8 [4];
  UInt32 *local_d8;
  UInt16 *local_d0;
  UInt16 *local_c8;
  ulong local_c0;
  UInt32 (*local_b8) [128];
  UInt32 (*local_b0) [64];
  UInt16 *local_a8;
  UInt32 (*local_a0) [272];
  UInt16 *local_98;
  UInt32 *local_90;
  UInt32 *local_88;
  UInt16 *local_80;
  UInt16 *local_78;
  undefined8 local_70;
  UInt16 *local_68;
  Byte *local_60;
  CLenPriceEnc *local_58;
  UInt16 (*local_50) [64];
  CLenPriceEnc *local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_00;
  
  local_ec = useLimits;
  if (p->inStream != (ISeqInStream *)0x0) {
    (p->matchFinderBase).stream = p->inStream;
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->inStream = (ISeqInStream *)0x0;
  }
  iVar27 = p->result;
  if (p->finished == 0) {
    if (iVar27 == 0) {
      if ((p->rc).res != 0) {
        p->result = 9;
      }
      if ((p->matchFinderBase).result != 0) {
        p->result = 8;
      }
      iVar27 = p->result;
      if (iVar27 != 0) {
        p->finished = 1;
      }
    }
    if (iVar27 == 0) {
      local_110 = p->nowPos64;
      iVar27 = 0;
      local_f4 = maxUnpackSize;
      if (local_110 == 0) {
        UVar9 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        uVar32 = local_110;
        if (UVar9 == 0) {
          iVar27 = Flush(p,(UInt32)local_110);
          uVar32 = uVar32 & 0xffffffff;
        }
        else {
          ReadMatchDistances(p,&local_1a8);
          RangeEnc_EncodeBit(&p->rc,p->isMatch[p->state],0);
          p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
          bVar8 = (*(p->matchFinder).GetIndexByte)(p->matchFinderObj,-p->additionalOffset);
          pUVar4 = p->litProbs;
          uVar11 = bVar8 | 0x100;
          do {
            RangeEnc_EncodeBit(&p->rc,(UInt16 *)((ulong)(uVar11 >> 7 & 0xfffffffe) + (long)pUVar4),
                               uVar11 >> 7 & 1);
            uVar11 = uVar11 * 2;
          } while (uVar11 < 0x10000);
          p->additionalOffset = p->additionalOffset - 1;
          uVar32 = 1;
        }
        if (UVar9 == 0) {
          return iVar27;
        }
      }
      else {
        uVar32 = local_110 & 0xffffffff;
      }
      UVar38 = (UInt32)uVar32;
      local_154 = iVar27;
      UVar9 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
      if (UVar9 != 0) {
        pUVar16 = p->reps;
        local_88 = &p->numPairs;
        local_1e8 = p->opt;
        local_1c8 = p->ProbPrices;
        local_1b8 = p->isMatch;
        local_148 = p->isRep0Long;
        local_d8 = p->opt[0].backs;
        local_120 = (p->repLenEnc).prices;
        local_a0 = (p->lenEnc).prices;
        local_b0 = p->posSlotPrices;
        local_b8 = p->distancesPrices;
        pCVar26 = &p->rc;
        local_a8 = p->isRep;
        local_48 = &p->lenEnc;
        local_50 = p->posSlotEncoder;
        local_78 = p->posAlignEncoder;
        local_80 = p->posEncoders;
        local_c8 = p->isRepG0;
        local_d0 = p->isRepG1;
        local_68 = p->isRepG2;
        local_58 = &p->repLenEnc;
        local_90 = p->ProbPrices + 0x7d;
        local_98 = (p->repLenEnc).p.high + 0xfc;
        local_130 = p->opt + 1;
        local_1f0 = pCVar26;
        local_1d8 = pUVar16;
        local_60 = (Byte *)(ulong)maxPackSize;
        do {
          uVar11 = (uint)uVar32;
          local_204 = uVar11;
          if (p->fastMode == 0) {
            uVar31 = p->optimumCurrentIndex;
            if (p->optimumEndIndex == uVar31) {
              p->optimumEndIndex = 0;
              p->optimumCurrentIndex = 0;
              if (p->additionalOffset == 0) {
                UVar9 = ReadMatchDistances(p,&local_14c);
              }
              else {
                UVar9 = p->longestMatchLength;
                local_14c = p->numPairs;
              }
              uVar31 = p->numAvail;
              if (uVar31 < 2) {
LAB_001966fe:
                local_208 = 0xffffffff;
                UVar38 = local_208;
                uVar31 = 1;
              }
              else {
                uVar40 = 0x111;
                if (uVar31 < 0x111) {
                  uVar40 = uVar31;
                }
                pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                pCVar26 = local_1f0;
                bVar8 = pBVar13[-1];
                if (uVar40 < 4) {
                  uVar40 = 3;
                }
                local_1a8 = (uint)*(undefined8 *)pUVar16;
                UStack_1a4 = (UInt32)((ulong)*(undefined8 *)pUVar16 >> 0x20);
                UStack_1a0 = (UInt32)*(undefined8 *)(pUVar16 + 2);
                UStack_19c = (UInt32)((ulong)*(undefined8 *)(pUVar16 + 2) >> 0x20);
                lVar18 = 0;
                UVar38 = 0;
                do {
                  uVar32 = (ulong)(p->reps[lVar18] + 1);
                  if ((bVar8 == pBVar13[~uVar32]) && (lVar34 = -uVar32, *pBVar13 == pBVar13[lVar34])
                     ) {
                    uVar32 = 2;
                    if (uVar31 != 2) {
                      uVar36 = 2;
                      do {
                        uVar32 = uVar36;
                        if (pBVar13[uVar36 - 1] != pBVar13[uVar36 + lVar34 + -1]) break;
                        uVar36 = uVar36 + 1;
                        uVar32 = (ulong)uVar40;
                      } while (uVar40 != uVar36);
                    }
                    local_e8[lVar18] = (uint)uVar32;
                    if (local_e8[UVar38] < (uint)uVar32) {
                      UVar38 = (uint)lVar18;
                    }
                  }
                  else {
                    local_e8[lVar18] = 0;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                uVar31 = local_e8[UVar38];
                if (uVar31 < p->numFastBytes) {
                  if (UVar9 < p->numFastBytes) {
                    bVar1 = pBVar13[~(ulong)(local_1a8 + 1)];
                    in_R9 = (UInt32 *)CONCAT71((int7)((ulong)in_R9 >> 8),bVar1);
                    if (((uVar31 < 2) && (UVar9 < 2)) && (bVar8 != bVar1)) goto LAB_001966fe;
                    uVar32 = (ulong)p->state;
                    p->opt[0].state = p->state;
                    bVar2 = (byte)p->lc;
                    uVar37 = p->pbMask & uVar11;
                    uVar36 = (ulong)uVar37;
                    uVar40 = (uint)(local_1b8[uVar32][uVar36] >> 4);
                    UVar38 = p->ProbPrices[uVar40];
                    if (uVar32 < 7) {
                      uVar43 = bVar8 + 0x100;
                      UVar10 = 0;
                      do {
                        UVar10 = UVar10 + local_1c8[((uint)(int)(char)uVar43 >> 7 & 0x7f0 ^
                                                    (uint)(p->litProbs +
                                                          ((uint)(pBVar13[-2] >> (8 - bVar2 & 0x1f))
                                                          + ((p->lpMask & uVar11) << (bVar2 & 0x1f))
                                                          ) * 0x300)[uVar43 >> 8]) >> 4];
                        uVar43 = uVar43 * 2;
                        uVar41 = uVar32;
                      } while (uVar43 < 0x10000);
                    }
                    else {
                      local_1f8 = (Byte *)CONCAT71(local_1f8._1_7_,bVar1);
                      local_200 = uVar32;
                      UVar10 = LitEnc_GetPriceMatched
                                         (p->litProbs +
                                          ((uint)(pBVar13[-2] >> (8 - bVar2 & 0x1f)) +
                                          ((p->lpMask & uVar11) << (bVar2 & 0x1f))) * 0x300,
                                          (uint)bVar8,(uint)bVar1,local_1c8);
                      in_R9 = (UInt32 *)CONCAT71((int7)((ulong)in_R9 >> 8),local_1f8._0_1_);
                      uVar41 = local_200;
                    }
                    pUVar4 = local_98;
                    uVar11 = UVar10 + UVar38;
                    p->opt[1].price = uVar11;
                    p->opt[1].backPrev = 0xffffffff;
                    p->opt[1].prev1IsChar = 0;
                    local_1f8 = (Byte *)CONCAT44(local_1f8._4_4_,p->ProbPrices[uVar40 ^ 0x7f]);
                    iVar27 = *(int *)((long)p->ProbPrices +
                                     (ulong)(p->isRep[uVar41] >> 2 & 0xfffffffc ^ 0x1fc)) +
                             p->ProbPrices[uVar40 ^ 0x7f];
                    if ((bVar8 == (byte)in_R9) &&
                       (uVar40 = p->ProbPrices[p->isRepG0[uVar41] >> 4] + iVar27 +
                                 p->ProbPrices[local_148[uVar32][uVar36] >> 4], uVar40 < uVar11)) {
                      p->opt[1].price = uVar40;
                      p->opt[1].backPrev = 0;
                      p->opt[1].prev1IsChar = 0;
                    }
                    if (uVar31 < UVar9) {
                      uVar31 = UVar9;
                    }
                    local_210 = (ulong)uVar31;
                    if (1 < uVar31) {
                      p->opt[1].posPrev = 0;
                      uVar15 = *(undefined8 *)(local_1d8 + 2);
                      *(undefined8 *)local_d8 = *(undefined8 *)local_1d8;
                      *(undefined8 *)(local_d8 + 2) = uVar15;
                      pCVar14 = local_1e8 + local_210;
                      uVar32 = local_210;
                      do {
                        uVar11 = (int)uVar32 - 1;
                        uVar32 = (ulong)uVar11;
                        pCVar14->price = 0x40000000;
                        pCVar14 = pCVar14 + -1;
                      } while (1 < uVar11);
                      local_200 = uVar36 * 0x440;
                      lVar18 = 0;
                      do {
                        uVar32 = (ulong)local_e8[lVar18];
                        if (1 < uVar32) {
                          UVar38 = GetPureRepPrice(p,(UInt32)lVar18,p->state,uVar37);
                          pCVar14 = local_1e8 + uVar32;
                          do {
                            uVar32 = uVar32 - 1;
                            uVar11 = *(int *)(pUVar4 + uVar36 * 0x220 + uVar32 * 2 + 2) +
                                     UVar38 + iVar27;
                            if (uVar11 < pCVar14->price) {
                              pCVar14->price = uVar11;
                              pCVar14->posPrev = 0;
                              pCVar14->backPrev = (UInt32)lVar18;
                              pCVar14->prev1IsChar = 0;
                            }
                            pCVar14 = pCVar14 + -1;
                          } while ((uVar32 & 0xfffffffe) != 0);
                        }
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      uVar32 = (ulong)(local_e8[0] + 1);
                      if (local_e8[0] < 2) {
                        uVar32 = 2;
                      }
                      if ((uint)uVar32 <= UVar9) {
                        UVar9 = p->ProbPrices[p->isRep[p->state] >> 4];
                        uVar36 = 0xfffffffe;
                        do {
                          uVar36 = (ulong)((int)uVar36 + 2);
                        } while (p->matches[uVar36] < (uint)uVar32);
                        while( true ) {
                          uVar11 = p->matches[(int)uVar36 + 1];
                          uVar31 = (uint)uVar32;
                          uVar40 = 3;
                          if (uVar31 < 5) {
                            uVar40 = uVar31 - 2;
                          }
                          if ((ulong)uVar11 < 0x80) {
                            uVar40 = local_b8[uVar40][uVar11];
                          }
                          else {
                            iVar27 = 6;
                            if (-1 < (int)(uVar11 - 0x80000)) {
                              iVar27 = 0x12;
                            }
                            uVar40 = local_b0[uVar40]
                                     [(uint)p->g_FastPos[uVar11 >> (sbyte)iVar27] + iVar27 * 2] +
                                     p->alignPrices[uVar11 & 0xf];
                          }
                          in_R9 = (UInt32 *)(ulong)uVar40;
                          uVar40 = *(int *)((long)*local_a0 + (ulong)(uVar31 - 2) * 4 + local_200) +
                                   (uint)local_1f8 + UVar9 + uVar40;
                          if (uVar40 < local_1e8[uVar32].price) {
                            pCVar14 = local_1e8 + uVar32;
                            pCVar14->price = uVar40;
                            in_R9 = (UInt32 *)0x0;
                            pCVar14->posPrev = 0;
                            pCVar14->backPrev = uVar11 + 4;
                            pCVar14->prev1IsChar = 0;
                          }
                          uVar11 = (int)uVar36 + 2;
                          if ((uVar31 == p->matches[uVar36]) && (uVar11 == local_14c)) break;
                          if (uVar31 == p->matches[uVar36]) {
                            uVar36 = (ulong)uVar11;
                          }
                          uVar32 = (ulong)(uVar31 + 1);
                        }
                      }
                      local_1e0 = (UInt32 *)0x0;
                      local_188 = 1;
                      uVar32 = (ulong)local_204;
                      uVar11 = 0xffe;
                      pCVar14 = local_1e8;
                      pUVar16 = local_1d8;
                      pCVar26 = local_1f0;
                      do {
                        local_1c0 = (ulong)uVar11;
                        uVar11 = (uint)local_1e0;
                        UVar9 = uVar11 + 1;
                        local_1e0 = (UInt32 *)(ulong)UVar9;
                        uVar31 = (uint)local_210;
                        if (UVar9 == uVar31) {
LAB_00197036:
                          local_f8 = Backward(p,&local_208,UVar9);
                          iVar27 = 1;
LAB_00197053:
                          iVar39 = (int)local_1c0;
                        }
                        else {
                          UVar9 = ReadMatchDistances(p,&local_1ac);
                          uVar15 = CONCAT44(extraout_var_00,UVar9);
                          if (p->numFastBytes <= UVar9) {
                            p->numPairs = local_1ac;
                            p->longestMatchLength = UVar9;
                            UVar9 = (UInt32)local_1e0;
                            goto LAB_00197036;
                          }
                          uVar36 = (ulong)local_1e0 & 0xffffffff;
                          pCVar20 = pCVar14 + uVar36;
                          uVar40 = pCVar14[uVar36].posPrev;
                          if (pCVar14[uVar36].prev1IsChar == 0) {
                            pCVar22 = &pCVar14[uVar40].state;
                          }
                          else {
                            uVar40 = uVar40 - 1;
                            if (pCVar20->prev2 == 0) {
                              pCVar22 = &pCVar14[uVar40].state;
                            }
                            else {
                              if (pCVar20->backPrev2 < 4) {
                                puVar19 = kRepNextStates;
                              }
                              else {
                                puVar19 = kMatchNextStates;
                              }
                              pCVar22 = (CState *)
                                        (puVar19 + (ulong)pCVar14[pCVar20->posPrev2].state * 4);
                            }
                            pCVar22 = (CState *)(kLiteralNextStates + (ulong)*pCVar22 * 4);
                          }
                          local_70 = uVar15;
                          if (uVar40 == uVar11) {
                            if (pCVar20->backPrev == 0) {
                              puVar19 = kShortRepNextStates;
                            }
                            else {
                              puVar19 = kLiteralNextStates;
                            }
                            uVar43 = *(uint *)(puVar19 + (ulong)*pCVar22 * 4);
                          }
                          else {
                            if ((pCVar14[uVar36].prev1IsChar == 0) || (pCVar20->prev2 == 0)) {
                              uVar37 = pCVar20->backPrev;
                              if (uVar37 < 4) goto LAB_00197107;
                              puVar19 = kMatchNextStates;
                            }
                            else {
                              uVar40 = pCVar20->posPrev2;
                              uVar37 = pCVar20->backPrev2;
LAB_00197107:
                              puVar19 = kRepNextStates;
                            }
                            uVar43 = *(uint *)(puVar19 + (ulong)*pCVar22 * 4);
                            uVar36 = (ulong)uVar40;
                            if (uVar37 < 4) {
                              local_1a8 = local_1e8[uVar36].backs[uVar37];
                              if (uVar37 == 0) {
                                uVar40 = 1;
                              }
                              else {
                                memcpy(&UStack_1a4,local_1e8[uVar36].backs,(ulong)(uVar37 * 4));
                                uVar40 = uVar37 + 1;
                              }
                              if (uVar40 < 4) {
                                memcpy((void *)((long)&local_1a8 + (ulong)(uVar40 << 2)),
                                       (void *)((uVar36 * 0x30 | (ulong)(uVar40 << 2)) +
                                               (long)local_d8),(ulong)(2 - uVar37) * 4 + 4);
                              }
                            }
                            else {
                              local_1a8 = uVar37 - 4;
                              UStack_19c = local_1e8[uVar36].backs[2];
                              UStack_1a4 = (UInt32)*(undefined8 *)local_1e8[uVar36].backs;
                              UStack_1a0 = (UInt32)((ulong)*(undefined8 *)local_1e8[uVar36].backs >>
                                                   0x20);
                            }
                          }
                          uVar40 = local_1a8;
                          uVar37 = (int)uVar32 + 1;
                          pCVar20->state = uVar43;
                          pCVar20->backs[0] = local_1a8;
                          pCVar20->backs[1] = UStack_1a4;
                          pCVar20->backs[2] = UStack_1a0;
                          pCVar20->backs[3] = UStack_19c;
                          UVar9 = pCVar20->price;
                          local_108 = uVar32;
                          local_178 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                          paUVar6 = local_1b8;
                          local_1f8 = local_178 + -1;
                          bVar8 = local_178[-1];
                          local_190 = (ulong)bVar8;
                          local_168 = (ulong)(p->pbMask & uVar37);
                          uVar32 = (ulong)uVar43;
                          bVar1 = (byte)p->lc;
                          UVar38 = p->ProbPrices[local_1b8[uVar32][local_168] >> 4];
                          local_200 = CONCAT44(local_200._4_4_,(uint)local_1f8[-(ulong)(uVar40 + 1)]
                                              );
                          local_1cc = UVar9;
                          local_160 = uVar32;
                          local_138 = (ulong)uVar37;
                          if (uVar43 < 7) {
                            uVar43 = bVar8 + 0x100;
                            UVar10 = 0;
                            do {
                              UVar10 = UVar10 + local_1c8[((uint)(int)(char)uVar43 >> 7 & 0x7f0 ^
                                                          (uint)(p->litProbs +
                                                                ((uint)(local_178[-2] >>
                                                                       (8 - bVar1 & 0x1f)) +
                                                                ((p->lpMask & uVar37) <<
                                                                (bVar1 & 0x1f))) * 0x300)
                                                                [uVar43 >> 8]) >> 4];
                              uVar43 = uVar43 * 2;
                            } while (uVar43 < 0x10000);
                          }
                          else {
                            UVar10 = LitEnc_GetPriceMatched
                                               (p->litProbs +
                                                ((uint)(local_178[-2] >> (8 - bVar1 & 0x1f)) +
                                                ((p->lpMask & uVar37) << (bVar1 & 0x1f))) * 0x300,
                                                (uint)bVar8,(uint)local_1f8[-(ulong)(uVar40 + 1)],
                                                local_1c8);
                          }
                          uVar35 = UVar38 + UVar9 + UVar10;
                          uVar37 = uVar11 + 2;
                          pCVar14 = local_1e8 + uVar37;
                          bVar45 = uVar35 < local_1e8[uVar37].price;
                          uVar43 = (uint)local_1e0;
                          if (bVar45) {
                            pCVar14->price = uVar35;
                            pCVar14->posPrev = uVar43;
                            pCVar14->backPrev = 0xffffffff;
                            pCVar14->prev1IsChar = 0;
                          }
                          local_1cc = local_1cc +
                                      *(int *)((long)p->ProbPrices +
                                              (ulong)(paUVar6[uVar32][local_168] >> 2 & 0xfffffffc ^
                                                     0x1fc));
                          local_1b0 = *(int *)((long)p->ProbPrices +
                                              (ulong)(p->isRep[local_160] >> 2 & 0xfffffffc ^ 0x1fc)
                                              ) + local_1cc;
                          cVar33 = (char)local_190;
                          if (((char)local_200 == cVar33) &&
                             (((uVar43 <= pCVar14->posPrev || (pCVar14->backPrev != 0)) &&
                              (uVar28 = p->ProbPrices[p->isRepG0[local_160] >> 4] + local_1b0 +
                                        p->ProbPrices[local_148[uVar32][local_168] >> 4],
                              uVar28 <= pCVar14->price)))) {
                            pCVar14->price = uVar28;
                            pCVar14->posPrev = uVar43;
                            pCVar14->backPrev = 0;
                            pCVar14->prev1IsChar = 0;
                            bVar45 = true;
                          }
                          uVar43 = p->numAvail;
                          local_170 = (ulong)uVar43;
                          uVar28 = 0xffe - uVar11;
                          if (uVar43 <= 0xffe - uVar11) {
                            uVar28 = uVar43;
                          }
                          iVar27 = 0x18;
                          pCVar14 = local_1e8;
                          in_R9 = local_1e0;
                          if (uVar28 < 2) {
                            uVar32 = local_138 & 0xffffffff;
                            pUVar16 = local_1d8;
                            pCVar26 = local_1f0;
                            goto LAB_00197053;
                          }
                          local_100 = p->numFastBytes;
                          local_c0 = (ulong)local_100;
                          uVar11 = local_100;
                          if (uVar28 < local_100) {
                            uVar11 = uVar28;
                          }
                          local_190 = CONCAT44(local_190._4_4_,uVar28);
                          local_180 = CONCAT44(local_180._4_4_,uVar11);
                          local_fc = (uint)local_1c0;
                          if (!bVar45 && (char)local_200 != cVar33) {
                            uVar21 = local_100 + 1;
                            if (uVar21 < uVar28) {
                              uVar28 = uVar21;
                            }
                            uVar17 = 1;
                            if (1 < uVar28) {
                              uVar17 = local_fc;
                              if (uVar43 < local_fc) {
                                uVar17 = uVar43;
                              }
                              if (uVar21 <= uVar17) {
                                uVar17 = uVar21;
                              }
                              uVar32 = local_1c0;
                              if (local_170 < local_1c0) {
                                uVar32 = local_170;
                              }
                              if (uVar21 <= uVar32) {
                                uVar32 = (ulong)uVar21;
                              }
                              uVar36 = 1;
                              do {
                                if (local_178[uVar36 - 1] !=
                                    local_178[uVar36 + (-1 - (ulong)(uVar40 + 1))]) {
                                  uVar17 = (uint)uVar36;
                                  break;
                                }
                                uVar36 = uVar36 + 1;
                              } while (uVar32 != uVar36);
                            }
                            if (1 < uVar17 - 1) {
                              uVar21 = (int)local_108 + 2U & p->pbMask;
                              uVar40 = *(uint *)(kLiteralNextStates + local_160 * 4);
                              iVar27 = *(int *)((long)p->ProbPrices +
                                               (ulong)(local_1b8[uVar40][uVar21] >> 2 & 0xfffffffc ^
                                                      0x1fc));
                              iVar39 = *(int *)((long)p->ProbPrices +
                                               (ulong)(p->isRep[uVar40] >> 2 & 0xfffffffc ^ 0x1fc));
                              uVar28 = (uVar17 - 1) + uVar37;
                              if (uVar31 < uVar28) {
                                pCVar20 = local_130 + local_210;
                                lVar18 = 0;
                                do {
                                  pCVar20->price = 0x40000000;
                                  lVar18 = lVar18 + -1;
                                  pCVar20 = pCVar20 + 1;
                                } while (local_210 - (uVar17 + (int)local_188) != lVar18);
                                local_210 = (ulong)(uVar31 - (int)lVar18);
                              }
                              uVar31 = iVar27 + uVar35 + iVar39 + local_120[uVar21][uVar17 - 3] +
                                       p->ProbPrices[p->isRepG0[uVar40] >> 4] +
                                       *(int *)((long)p->ProbPrices +
                                               (ulong)(local_148[uVar40][uVar21] >> 2 & 0xfffffffc ^
                                                      0x1fc));
                              if (uVar31 < local_1e8[uVar28].price) {
                                pCVar20 = local_1e8 + uVar28;
                                pCVar20->price = uVar31;
                                pCVar20->posPrev = uVar37;
                                pCVar20->backPrev = 0;
                                pCVar20->prev1IsChar = 1;
                                pCVar20->prev2 = 0;
                              }
                            }
                          }
                          if (uVar43 < local_100) {
                            local_100 = uVar43;
                          }
                          if (local_fc <= local_100) {
                            local_100 = local_fc;
                          }
                          if (uVar43 < local_fc) {
                            local_fc = uVar43;
                          }
                          uVar32 = local_170;
                          if (local_c0 < local_170) {
                            uVar32 = local_c0;
                          }
                          if (local_1c0 <= uVar32) {
                            uVar32 = local_1c0;
                          }
                          local_108 = local_168 * 0x440;
                          local_128 = local_120 + local_168;
                          uVar36 = 2;
                          lVar18 = 0;
                          pBVar13 = local_178;
                          pBVar44 = local_1f8;
                          local_118 = uVar32;
                          do {
                            pBVar42 = pBVar44 + -(ulong)((&local_1a8)[lVar18] + 1);
                            if ((*pBVar44 == *pBVar42) && (*pBVar13 == pBVar42[1])) {
                              lVar34 = -(ulong)((&local_1a8)[lVar18] + 1);
                              uVar41 = 2;
                              if (2 < uVar11) {
                                uVar41 = 2;
                                do {
                                  if (pBVar13[uVar41 - 1] != pBVar13[uVar41 + lVar34 + -1])
                                  goto LAB_0019775c;
                                  uVar41 = uVar41 + 1;
                                } while (uVar32 != uVar41);
                                uVar41 = (ulong)local_100;
                              }
LAB_0019775c:
                              iVar27 = (int)uVar41;
                              uVar11 = iVar27 + (int)in_R9;
                              local_140 = (ulong)uVar11;
                              if ((uint)local_210 < uVar11) {
                                pCVar20 = local_130 + local_210;
                                lVar23 = 0;
                                do {
                                  pCVar20->price = 0x40000000;
                                  lVar23 = lVar23 + -1;
                                  pCVar20 = pCVar20 + 1;
                                } while (local_210 - (uint)((int)local_188 + iVar27) != lVar23);
                                local_210 = (ulong)((uint)local_210 - (int)lVar23);
                              }
                              UVar38 = (UInt32)lVar18;
                              local_200 = uVar36;
                              UVar9 = GetPureRepPrice(p,UVar38,(UInt32)local_160,(UInt32)local_168);
                              iVar39 = UVar9 + local_1b0;
                              pUVar16 = *local_128 + (iVar27 - 2U);
                              uVar32 = uVar41 & 0xffffffff;
                              do {
                                uVar11 = *pUVar16 + iVar39;
                                uVar31 = (int)local_188 + (int)uVar32;
                                if (uVar11 < pCVar14[uVar31].price) {
                                  pCVar20 = pCVar14 + uVar31;
                                  pCVar20->price = uVar11;
                                  pCVar20->posPrev = (UInt32)local_1e0;
                                  pCVar20->backPrev = UVar38;
                                  pCVar20->prev1IsChar = 0;
                                }
                                uVar11 = (int)uVar32 - 1;
                                uVar32 = (ulong)uVar11;
                                pUVar16 = pUVar16 + -1;
                              } while (1 < uVar11);
                              uVar11 = iVar27 + 1;
                              uVar36 = local_200 & 0xffffffff;
                              if (lVar18 == 0) {
                                uVar36 = (ulong)uVar11;
                              }
                              uVar40 = (int)local_c0 + iVar27 + 1;
                              uVar31 = (uint)local_190;
                              if (uVar40 < (uint)local_190) {
                                uVar31 = uVar40;
                              }
                              uVar37 = uVar11;
                              if (uVar11 < uVar31) {
                                uVar31 = uVar40;
                                if (local_fc < uVar40) {
                                  uVar31 = local_fc;
                                }
                                uVar32 = local_1c0;
                                if (local_170 < local_1c0) {
                                  uVar32 = local_170;
                                }
                                uVar24 = (ulong)uVar11;
                                if (uVar40 <= uVar32) {
                                  uVar32 = (ulong)uVar40;
                                }
                                do {
                                  if (local_1f8[uVar24] != local_1f8[uVar24 + lVar34])
                                  goto LAB_001978aa;
                                  uVar24 = uVar24 + 1;
                                } while (uVar32 != uVar24);
                                uVar24 = (ulong)uVar31;
LAB_001978aa:
                                uVar37 = (uint)uVar24;
                              }
                              if (1 < uVar37 - uVar11) {
                                local_40 = (ulong)*(uint *)(kRepNextStates + local_160 * 4);
                                uVar31 = iVar27 + (int)local_138;
                                local_150 = p->pbMask;
                                bVar8 = (byte)p->lc;
                                UVar9 = (*local_128)[iVar27 - 2U];
                                local_f0 = p->ProbPrices
                                           [local_1b8[local_40][local_150 & uVar31] >> 4];
                                local_200 = uVar36;
                                local_38 = (ulong)(uVar37 - uVar11);
                                UVar10 = LitEnc_GetPriceMatched
                                                   (p->litProbs +
                                                    ((uint)(local_1f8[iVar27 - 1] >>
                                                           (8 - bVar8 & 0x1f)) +
                                                    ((uVar31 & p->lpMask) << (bVar8 & 0x1f))) *
                                                    0x300,(uint)local_1f8[uVar41 & 0xffffffff],
                                                    (uint)pBVar42[uVar41 & 0xffffffff],local_1c8);
                                uVar11 = *(uint *)(kLiteralNextStates + local_40 * 4);
                                uVar31 = (int)local_138 + iVar27 + 1U & local_150;
                                iVar27 = *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_1b8[uVar11][uVar31] >> 2 & 0xfffffffc
                                                        ^ 0x1fc));
                                iVar3 = *(int *)((long)p->ProbPrices +
                                                (ulong)(p->isRep[uVar11] >> 2 & 0xfffffffc ^ 0x1fc))
                                ;
                                uVar40 = (int)local_140 + (int)local_38 + 1;
                                if ((uint)local_210 < uVar40) {
                                  pCVar14 = local_130 + local_210;
                                  lVar34 = 0;
                                  do {
                                    pCVar14->price = 0x40000000;
                                    lVar34 = lVar34 + -1;
                                    pCVar14 = pCVar14 + 1;
                                  } while (local_210 - (uVar37 + (int)local_188) != lVar34);
                                  local_210 = (ulong)((uint)local_210 - (int)lVar34);
                                  local_150 = UVar10;
                                }
                                uVar11 = UVar9 + iVar39 + local_f0 + UVar10 + iVar27 + iVar3 +
                                         local_120[uVar31][(int)local_38 - 2] +
                                         p->ProbPrices[p->isRepG0[uVar11] >> 4] +
                                         *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_148[uVar11][uVar31] >> 2 & 0xfffffffc
                                                        ^ 0x1fc));
                                uVar36 = local_200;
                                if (uVar11 < local_1e8[uVar40].price) {
                                  pCVar14 = local_1e8 + uVar40;
                                  pCVar14->price = uVar11;
                                  pCVar14->posPrev = (int)local_140 + 1;
                                  pCVar14->backPrev = 0;
                                  pCVar14->prev1IsChar = 1;
                                  pCVar14->prev2 = 1;
                                  pCVar14->posPrev2 = (UInt32)local_1e0;
                                  pCVar14->backPrev2 = UVar38;
                                }
                              }
                              uVar32 = local_118;
                              pCVar14 = local_1e8;
                              in_R9 = local_1e0;
                              pBVar13 = local_178;
                              pBVar44 = local_1f8;
                              uVar11 = (uint)local_180;
                            }
                            lVar18 = lVar18 + 1;
                          } while (lVar18 != 4);
                          uVar31 = (uint)local_70;
                          uVar40 = uVar31;
                          if (uVar11 < uVar31) {
                            uVar32 = 0xfffffffe;
                            do {
                              iVar27 = (int)uVar32;
                              uVar32 = (ulong)(iVar27 + 2);
                            } while (p->matches[uVar32] < uVar11);
                            p->matches[uVar32] = uVar11;
                            local_1ac = iVar27 + 4;
                            uVar40 = uVar11;
                          }
                          iVar27 = 0;
                          pUVar16 = local_1d8;
                          if (uVar40 < (uint)uVar36) {
                            uVar32 = local_138 & 0xffffffff;
                            pCVar26 = local_1f0;
                            goto LAB_00197053;
                          }
                          local_1cc = local_1cc + p->ProbPrices[p->isRep[local_160] >> 4];
                          uVar11 = (uint)local_170;
                          uVar37 = (uint)local_1c0;
                          if ((uint)local_210 < uVar40 + (int)in_R9) {
                            if (uVar11 <= uVar31) {
                              uVar31 = uVar11;
                            }
                            if ((uint)local_c0 <= uVar31) {
                              uVar31 = (uint)local_c0;
                            }
                            if (uVar37 <= uVar31) {
                              uVar31 = uVar37;
                            }
                            pCVar20 = local_130 + local_210;
                            lVar18 = 0;
                            do {
                              pCVar20->price = 0x40000000;
                              lVar18 = lVar18 + -1;
                              pCVar20 = pCVar20 + 1;
                            } while (local_210 - (uVar31 + (int)local_188) != lVar18);
                            local_210 = (ulong)((uint)local_210 - (int)lVar18);
                          }
                          uVar32 = 0xfffffffe;
                          do {
                            iVar27 = (int)uVar32;
                            uVar32 = (ulong)(iVar27 + 2);
                          } while (p->matches[uVar32] < (uint)uVar36);
                          uVar31 = p->matches[iVar27 + 3];
                          iVar27 = 0x12;
                          if ((int)(uVar31 - 0x80000) < 0) {
                            iVar27 = 6;
                          }
                          local_168 = CONCAT44(local_168._4_4_,
                                               (uint)p->g_FastPos[uVar31 >> (sbyte)iVar27] +
                                               iVar27 * 2);
                          local_178 = (Byte *)CONCAT44(local_178._4_4_,local_1ac);
                          if (uVar37 <= uVar11) {
                            local_170 = local_1c0;
                          }
                          local_170 = local_170 & 0xffffffff;
                          uVar11 = (uint)local_190;
                          do {
                            uVar40 = (uint)uVar36;
                            uVar41 = (ulong)(uVar40 - 2);
                            lVar18 = uVar41 * 4;
                            if (4 < uVar40) {
                              uVar41 = 3;
                            }
                            if (uVar31 < 0x80) {
                              UVar9 = local_b8[uVar41][uVar31];
                            }
                            else {
                              UVar9 = p->alignPrices[uVar31 & 0xf] +
                                      local_b0[uVar41][local_168 & 0xffffffff];
                            }
                            uVar37 = *(int *)((long)*local_a0 + lVar18 + local_108) + local_1cc +
                                     UVar9;
                            paUVar30 = (UInt32 (*) [272])(ulong)(uVar40 + (UInt32)in_R9);
                            if (uVar37 < pCVar14[(long)paUVar30].price) {
                              pCVar20 = pCVar14 + (long)paUVar30;
                              pCVar20->price = uVar37;
                              pCVar20->posPrev = (UInt32)in_R9;
                              pCVar20->backPrev = uVar31 + 4;
                              pCVar20->prev1IsChar = 0;
                            }
                            uVar41 = (ulong)(uVar40 + 1);
                            uVar35 = (uint)uVar32;
                            bVar45 = true;
                            uVar43 = uVar35;
                            if (uVar40 == p->matches[uVar32]) {
                              uVar28 = uVar40 + 1;
                              uVar43 = p->numFastBytes + uVar40 + 1;
                              if (uVar11 <= uVar43) {
                                uVar43 = uVar11;
                              }
                              uVar32 = (ulong)uVar28;
                              if (uVar28 < uVar43) {
                                uVar11 = p->numFastBytes + uVar40 + 1;
                                local_140 = (ulong)uVar11;
                                if ((uint)local_170 < uVar11) {
                                  local_140 = local_170 & 0xffffffff;
                                }
                                uVar24 = uVar41;
                                do {
                                  in_R9 = local_1e0;
                                  if (pBVar44[uVar24] != pBVar44[uVar24 - (uVar31 + 1)]) {
                                    uVar32 = uVar24 & 0xffffffff;
                                    break;
                                  }
                                  uVar24 = uVar24 + 1;
                                  uVar32 = local_140;
                                } while (uVar24 < uVar43);
                              }
                              uVar28 = (int)uVar32 - uVar28;
                              local_200 = uVar41;
                              if (uVar28 < 2) {
LAB_0019806f:
                                uVar11 = (uint)local_190;
                              }
                              else {
                                local_180 = (ulong)*(uint *)(kMatchNextStates + local_160 * 4);
                                uVar11 = uVar40 + (int)local_138;
                                local_1b0 = p->pbMask;
                                uVar43 = local_1b0 & uVar11;
                                bVar8 = (byte)p->lc;
                                UVar9 = p->ProbPrices[local_1b8[local_180][uVar43] >> 4];
                                local_140 = uVar32;
                                local_128 = paUVar30;
                                UVar38 = LitEnc_GetPriceMatched
                                                   (p->litProbs +
                                                    ((uint)(pBVar44[uVar40 - 1] >>
                                                           (8 - bVar8 & 0x1f)) +
                                                    ((uVar11 & p->lpMask) << (bVar8 & 0x1f))) *
                                                    0x300,(uint)pBVar44[uVar36 & 0xffffffff],
                                                    (uint)pBVar44[(uVar36 & 0xffffffff) -
                                                                  (ulong)(uVar31 + 1)],local_1c8);
                                uVar11 = *(uint *)(kLiteralNextStates + local_180 * 4);
                                uVar43 = uVar43 + 1 & local_1b0;
                                iVar27 = *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_1b8[uVar11][uVar43] >> 2 & 0xfffffffc
                                                        ^ 0x1fc));
                                iVar39 = *(int *)((long)p->ProbPrices +
                                                 (ulong)(p->isRep[uVar11] >> 2 & 0xfffffffc ^ 0x1fc)
                                                 );
                                uVar40 = (int)local_128 + uVar28 + 1;
                                if ((uint)local_210 < uVar40) {
                                  pCVar14 = local_130 + local_210;
                                  lVar18 = 0;
                                  do {
                                    pCVar14->price = 0x40000000;
                                    lVar18 = lVar18 + -1;
                                    pCVar14 = pCVar14 + 1;
                                  } while (local_210 - (uint)((int)local_140 + (int)local_188) !=
                                           lVar18);
                                  local_210 = (ulong)((uint)local_210 - (int)lVar18);
                                }
                                uVar11 = UVar9 + uVar37 + UVar38 + iVar27 + iVar39 +
                                         local_120[uVar43][uVar28 - 2] +
                                         p->ProbPrices[p->isRepG0[uVar11] >> 4] +
                                         *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_148[uVar11][uVar43] >> 2 & 0xfffffffc
                                                        ^ 0x1fc));
                                pUVar16 = local_1d8;
                                in_R9 = local_1e0;
                                pBVar44 = local_1f8;
                                if (local_1e8[uVar40].price <= uVar11) goto LAB_0019806f;
                                pCVar14 = local_1e8 + uVar40;
                                pCVar14->price = uVar11;
                                pCVar14->posPrev = (int)local_128 + 1;
                                pCVar14->backPrev = 0;
                                pCVar14->prev1IsChar = 1;
                                pCVar14->prev2 = 1;
                                pCVar14->posPrev2 = (UInt32)local_1e0;
                                pCVar14->backPrev2 = uVar31 + 4;
                                uVar11 = (uint)local_190;
                              }
                              uVar43 = uVar35 + 2;
                              bVar45 = uVar43 != (uint)local_178;
                              pCVar14 = local_1e8;
                              uVar41 = local_200;
                              if (bVar45) {
                                uVar31 = p->matches[uVar35 + 3];
                                if (0x7f < uVar31) {
                                  iVar27 = 0x12;
                                  if ((int)(uVar31 - 0x80000) < 0) {
                                    iVar27 = 6;
                                  }
                                  local_168 = CONCAT44(local_168._4_4_,
                                                       (uint)p->g_FastPos[uVar31 >> (sbyte)iVar27] +
                                                       iVar27 * 2);
                                }
                                bVar45 = true;
                              }
                            }
                            uVar32 = (ulong)uVar43;
                            uVar36 = uVar41;
                          } while (bVar45);
                          uVar32 = local_138 & 0xffffffff;
                          iVar39 = (int)local_1c0;
                          iVar27 = 0;
                          pCVar26 = local_1f0;
                        }
                        if ((iVar27 != 0x18) &&
                           (uVar11 = local_204, UVar38 = local_208, uVar31 = local_f8, iVar27 != 0))
                        goto LAB_001961fb;
                        uVar11 = iVar39 - 1;
                        local_188 = (ulong)((int)local_188 + 1);
                      } while( true );
                    }
                    pUVar16 = local_1d8;
                    pCVar26 = local_1f0;
                    uVar11 = local_204;
                    UVar38 = p->opt[1].backPrev;
                    uVar31 = 1;
                  }
                  else {
                    local_208 = p->matches[local_14c - 1] + 4;
                    UVar10 = UVar9 - 1;
                    UVar38 = local_208;
                    uVar31 = UVar9;
                    if (UVar10 != 0) {
                      p->additionalOffset = p->additionalOffset + UVar10;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar10);
                      UVar38 = local_208;
                    }
                  }
                }
                else {
                  UVar9 = uVar31 - 1;
                  if (UVar9 != 0) {
                    p->additionalOffset = p->additionalOffset + UVar9;
                    local_208 = UVar38;
                    (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                    UVar38 = local_208;
                  }
                }
              }
            }
            else {
              UVar9 = local_1e8[uVar31].posPrev;
              UVar38 = local_1e8[uVar31].backPrev;
              p->optimumCurrentIndex = UVar9;
              uVar31 = UVar9 - uVar31;
            }
          }
          else {
            if (p->additionalOffset == 0) {
              UVar9 = ReadMatchDistances(p,&local_1a8);
              uVar32 = CONCAT44(extraout_var,UVar9);
            }
            else {
              uVar32 = (ulong)p->longestMatchLength;
              local_1a8 = p->numPairs;
            }
            uVar40 = p->numAvail;
            local_208 = 0xffffffff;
            uVar11 = local_204;
            UVar38 = local_208;
            uVar31 = 1;
            if (1 < uVar40) {
              uVar37 = 0x111;
              if (uVar40 < 0x111) {
                uVar37 = uVar40;
              }
              local_200 = uVar32;
              pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              if (uVar37 < 4) {
                uVar37 = 3;
              }
              uVar41 = 0;
              uVar36 = 0;
              uVar32 = 0;
              local_1f8 = (Byte *)CONCAT44(local_1f8._4_4_,uVar40);
              UVar38 = local_208;
              do {
                bVar45 = false;
                if ((pBVar13[-1] == pBVar13[~(ulong)(pUVar16[uVar41] + 1)]) &&
                   (lVar18 = -(ulong)(pUVar16[uVar41] + 1), *pBVar13 == pBVar13[lVar18])) {
                  uVar24 = 2;
                  if (uVar40 != 2) {
                    uVar25 = 2;
                    do {
                      uVar24 = uVar25;
                      if (pBVar13[uVar25 - 1] != pBVar13[uVar25 + lVar18 + -1]) break;
                      uVar25 = uVar25 + 1;
                      uVar24 = (ulong)uVar37;
                    } while (uVar37 != uVar25);
                  }
                  uVar11 = (uint)uVar24;
                  if (uVar11 < p->numFastBytes) {
                    uVar31 = (uint)uVar32;
                    if (uVar31 < uVar11) {
                      uVar32 = uVar24;
                    }
                    uVar32 = uVar32 & 0xffffffff;
                    if (uVar31 < uVar11) {
                      uVar36 = uVar41 & 0xffffffff;
                    }
                    bVar45 = false;
                    pUVar16 = local_1d8;
                  }
                  else {
                    bVar45 = true;
                    UVar9 = uVar11 - 1;
                    if (UVar9 != 0) {
                      p->additionalOffset = p->additionalOffset + UVar9;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                      uVar40 = (uint)local_1f8;
                    }
                    in_R9 = (UInt32 *)(uVar24 & 0xffffffff);
                    pUVar16 = local_1d8;
                    UVar38 = (uint)uVar41;
                  }
                }
                pCVar26 = local_1f0;
                uVar11 = local_204;
                uVar43 = (uint)in_R9;
                uVar31 = uVar43;
                if (bVar45) goto LAB_001961fb;
                uVar41 = uVar41 + 1;
              } while (uVar41 != 4);
              uVar31 = (uint)local_200;
              if (uVar31 < p->numFastBytes) {
                uVar41 = 0;
                uVar37 = uVar31;
                if (1 < uVar31) {
                  uVar41 = (ulong)local_1a8;
                  uVar35 = p->matches[local_1a8 - 1];
                  if (2 < uVar41) {
                    pUVar29 = local_90 + uVar41;
                    uVar25 = uVar41 + 0xfffffffc;
                    uVar24 = local_200;
                    do {
                      local_1a8 = (uint)uVar41;
                      uVar37 = p->matches[uVar25 & 0xffffffff];
                      uVar31 = (uint)uVar24;
                      if ((uVar31 != uVar37 + 1) || (uVar28 = *pUVar29, uVar35 >> 7 <= uVar28))
                      break;
                      local_1a8 = local_1a8 - 2;
                      uVar41 = (ulong)local_1a8;
                      pUVar29 = pUVar29 + -2;
                      uVar25 = uVar25 - 2;
                      uVar24 = (ulong)uVar37;
                      uVar35 = uVar28;
                      uVar31 = uVar37;
                    } while (2 < local_1a8);
                  }
                  uVar41 = (ulong)uVar35;
                  uVar37 = uVar31;
                  if (0x7f < uVar35) {
                    uVar37 = 1;
                  }
                  if (uVar31 != 2) {
                    uVar37 = uVar31;
                  }
                }
                uVar31 = (uint)uVar32;
                uVar35 = (uint)uVar41;
                if ((uVar31 < 2) ||
                   (((uVar31 + 1 < uVar37 && ((uVar31 + 2 < uVar37 || (uVar35 < 0x200)))) &&
                    ((uVar31 + 3 < uVar37 || (uVar35 < 0x8000)))))) {
                  uVar31 = 1;
                  if ((uVar40 != 2) && (uVar31 = 1, 1 < uVar37)) {
                    local_208 = UVar38;
                    UVar9 = ReadMatchDistances(p,local_88);
                    p->longestMatchLength = UVar9;
                    if (1 < UVar9) {
                      uVar31 = p->matches[p->numPairs - 1];
                      uVar40 = 1;
                      if ((UVar9 < uVar37) || (uVar35 <= uVar31)) {
                        bVar45 = false;
                        if ((UVar9 <= uVar37 + 1) &&
                           ((UVar9 != uVar37 + 1 || uVar35 < uVar31 >> 7 &&
                            (bVar46 = UVar9 + 1 < uVar37, bVar5 = (uint)(uVar41 >> 7) <= uVar31,
                            bVar45 = bVar5 || (uVar37 < 3 || bVar46), uVar40 = uVar43,
                            !bVar5 && (uVar37 >= 3 && !bVar46))))) {
                          uVar40 = 1;
                        }
                      }
                      else {
                        bVar45 = false;
                      }
                      uVar43 = uVar40;
                      UVar38 = local_208;
                      uVar31 = uVar43;
                      if (!bVar45) goto LAB_001961fb;
                    }
                    pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                    uVar40 = uVar37 - 1;
                    lVar18 = 0;
                    do {
                      in_R9 = (UInt32 *)0xc;
                      if ((pBVar13[-1] == pBVar13[~(ulong)(pUVar16[lVar18] + 1)]) &&
                         (lVar34 = -(ulong)(pUVar16[lVar18] + 1), *pBVar13 == pBVar13[lVar34])) {
                        bVar45 = uVar40 < 3;
                        uVar31 = 1;
                        if (2 < uVar40) {
                          if (pBVar13[1] == pBVar13[lVar34 + 1]) {
                            uVar32 = 3;
                            do {
                              uVar36 = uVar32;
                              if (uVar40 == uVar36) {
                                uVar43 = 1;
                                break;
                              }
                              uVar32 = uVar36 + 1;
                            } while (pBVar13[uVar36 - 1] == pBVar13[uVar36 + lVar34 + -1]);
                            bVar45 = uVar40 <= uVar36;
                            uVar31 = uVar43;
                          }
                          else {
                            bVar45 = false;
                            uVar31 = uVar43;
                          }
                        }
                        in_R9 = (UInt32 *)(ulong)bVar45;
                        uVar43 = uVar31;
                      }
                      if (((int)in_R9 != 0xc) &&
                         (UVar38 = local_208, uVar31 = uVar43, (int)in_R9 != 0)) goto LAB_001961fb;
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 4);
                    local_208 = uVar35 + 4;
                    UVar9 = uVar37 - 2;
                    UVar38 = local_208;
                    uVar31 = uVar37;
                    if (UVar9 != 0) {
                      p->additionalOffset = p->additionalOffset + UVar9;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                      UVar38 = local_208;
                    }
                  }
                }
                else {
                  UVar9 = uVar31 - 1;
                  UVar38 = (uint)uVar36;
                  if (UVar9 != 0) {
                    p->additionalOffset = p->additionalOffset + UVar9;
                    local_208 = (uint)uVar36;
                    (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                    UVar38 = local_208;
                  }
                }
              }
              else {
                local_208 = p->matches[local_1a8 - 1] + 4;
                UVar9 = uVar31 - 1;
                UVar38 = local_208;
                if (UVar9 != 0) {
                  p->additionalOffset = p->additionalOffset + UVar9;
                  (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                  uVar11 = local_204;
                  UVar38 = local_208;
                }
              }
            }
          }
LAB_001961fb:
          local_208 = UVar38;
          UVar9 = local_208;
          uVar40 = p->pbMask & uVar11;
          if (local_208 == 0xffffffff && uVar31 == 1) {
            RangeEnc_EncodeBit(pCVar26,local_1b8[p->state] + uVar40,0);
            pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
            bVar8 = (byte)p->lc;
            iVar27 = (uint)(pBVar13[-1 - (ulong)p->additionalOffset] >> (8 - bVar8 & 0x1f)) +
                     ((p->lpMask & uVar11) << (bVar8 & 0x1f));
            pUVar4 = p->litProbs;
            uVar40 = (uint)pBVar13[-(ulong)p->additionalOffset];
            if (p->state < 7) {
              uVar40 = uVar40 | 0x100;
              do {
                RangeEnc_EncodeBit(pCVar26,(UInt16 *)
                                           ((long)pUVar4 +
                                           (ulong)(uVar40 >> 7 & 0x1fffffe) +
                                           (ulong)(uint)(iVar27 * 0x300) * 2),uVar40 >> 7 & 1);
                uVar40 = uVar40 * 2;
              } while (uVar40 < 0x10000);
            }
            else {
              uVar37 = (uint)(pBVar13 + -(ulong)p->additionalOffset)[~(ulong)p->reps[0]];
              uVar40 = uVar40 | 0x100;
              uVar43 = 0x100;
              do {
                uVar37 = uVar37 * 2;
                RangeEnc_EncodeBit(pCVar26,pUVar4 + (ulong)(uint)(iVar27 * 0x300) +
                                                    (ulong)((uVar40 >> 8) + uVar43 +
                                                           (uVar37 & uVar43)),uVar40 >> 7 & 1);
                uVar40 = uVar40 * 2;
                uVar43 = uVar43 & ~(uVar40 ^ uVar37);
              } while (uVar40 < 0x10000);
            }
            p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
            pUVar16 = local_1d8;
          }
          else {
            uVar32 = (ulong)local_208;
            RangeEnc_EncodeBit(pCVar26,local_1b8[p->state] + uVar40,1);
            if (UVar9 < 4) {
              RangeEnc_EncodeBit(pCVar26,local_a8 + p->state,1);
              if (uVar32 == 0) {
                RangeEnc_EncodeBit(pCVar26,local_c8 + p->state,0);
                RangeEnc_EncodeBit(pCVar26,local_148[p->state] + uVar40,(uint)(uVar31 != 1));
              }
              else {
                UVar38 = p->reps[uVar32];
                RangeEnc_EncodeBit(pCVar26,local_c8 + p->state,1);
                if (uVar32 == 1) {
                  RangeEnc_EncodeBit(pCVar26,local_d0 + p->state,0);
                }
                else {
                  RangeEnc_EncodeBit(pCVar26,local_d0 + p->state,1);
                  RangeEnc_EncodeBit(pCVar26,local_68 + p->state,UVar9 - 2);
                  if (uVar32 == 3) {
                    p->reps[3] = p->reps[2];
                  }
                  p->reps[2] = p->reps[1];
                }
                p->reps[1] = p->reps[0];
                p->reps[0] = UVar38;
                pUVar16 = local_1d8;
              }
              uVar11 = local_204;
              in_R9 = local_1c8;
              if (uVar31 == 1) {
                uVar40 = p->state;
                puVar19 = kShortRepNextStates;
              }
              else {
                LenEnc_Encode2(local_58,pCVar26,uVar31 - 2,uVar40,(uint)(p->fastMode == 0),local_1c8
                              );
                uVar40 = p->state;
                puVar19 = kRepNextStates;
              }
              p->state = *(UInt32 *)(puVar19 + (ulong)uVar40 * 4);
            }
            else {
              RangeEnc_EncodeBit(pCVar26,local_a8 + p->state,0);
              p->state = *(UInt32 *)(kMatchNextStates + (ulong)p->state * 4);
              in_R9 = local_1c8;
              LenEnc_Encode2(local_48,pCVar26,uVar31 - 2,uVar40,(uint)(p->fastMode == 0),local_1c8);
              paUVar7 = local_50;
              pCVar26 = local_1f0;
              local_208 = UVar9 - 4;
              local_1f8 = (Byte *)CONCAT44(local_1f8._4_4_,local_208);
              if (local_208 < 0x80) {
                uVar11 = (uint)p->g_FastPos[local_208];
              }
              else {
                iVar27 = 0x12;
                if ((int)(UVar9 - 0x80004) < 0) {
                  iVar27 = 6;
                }
                uVar11 = (uint)p->g_FastPos[local_208 >> (sbyte)iVar27] + iVar27 * 2;
              }
              uVar40 = uVar31 - 2;
              if (4 < uVar31) {
                uVar40 = 3;
              }
              uVar32 = 1;
              uVar37 = 5;
              do {
                bVar45 = (uVar11 >> (uVar37 & 0x1f) & 1) != 0;
                RangeEnc_EncodeBit(pCVar26,paUVar7[uVar40] + uVar32,(uint)bVar45);
                pUVar4 = local_80;
                p_00 = local_1f0;
                uVar32 = (ulong)((uint)bVar45 + (int)uVar32 * 2);
                bVar45 = uVar37 != 0;
                uVar37 = uVar37 - 1;
              } while (bVar45);
              if (3 < uVar11) {
                iVar27 = (uVar11 >> 1) - 1;
                uVar40 = (uVar11 & 1 | 2) << ((byte)iVar27 & 0x1f);
                uVar37 = (uint)local_1f8 - uVar40;
                uVar32 = (ulong)uVar37;
                pCVar26 = p_00;
                if (uVar11 < 0xe) {
                  uVar36 = 1;
                  do {
                    uVar37 = (uint)uVar32 & 1;
                    RangeEnc_EncodeBit(p_00,(UInt16 *)
                                            ((long)pUVar4 +
                                            uVar36 * 2 +
                                            ((ulong)uVar40 * 2 - (ulong)(uVar11 * 2)) + -2),uVar37);
                    uVar36 = (ulong)(uVar37 + (int)uVar36 * 2);
                    uVar32 = uVar32 >> 1;
                    iVar27 = iVar27 + -1;
                  } while (iVar27 != 0);
                }
                else {
                  RangeEnc_EncodeDirectBits(local_1f0,uVar37 >> 4,(uVar11 >> 1) - 5);
                  pUVar4 = local_78;
                  uVar32 = (ulong)(uVar37 & 0xf);
                  uVar36 = 1;
                  iVar27 = 4;
                  do {
                    uVar11 = (uint)uVar32 & 1;
                    RangeEnc_EncodeBit(p_00,pUVar4 + uVar36,uVar11);
                    uVar36 = (ulong)(uVar11 + (int)uVar36 * 2);
                    uVar32 = uVar32 >> 1;
                    iVar27 = iVar27 + -1;
                  } while (iVar27 != 0);
                  p->alignPriceCount = p->alignPriceCount + 1;
                }
              }
              p->reps[3] = p->reps[2];
              *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
              p->reps[0] = (uint)local_1f8;
              p->matchPriceCount = p->matchPriceCount + 1;
              pUVar16 = local_1d8;
              uVar11 = local_204;
            }
          }
          UVar38 = uVar11 + uVar31;
          uVar32 = (ulong)UVar38;
          iVar27 = 0;
          pUVar29 = &p->additionalOffset;
          *pUVar29 = *pUVar29 - uVar31;
          if (*pUVar29 == 0) {
            if (p->fastMode == 0) {
              if (0x7f < p->matchPriceCount) {
                FillDistancesPrices(p);
              }
              if (0xf < p->alignPriceCount) {
                FillAlignPrices(p);
              }
            }
            UVar9 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
            if (UVar9 == 0) {
              iVar27 = 2;
            }
            else {
              uVar11 = UVar38 - (int)local_110;
              if (local_ec == 0) {
                if (0x7fff < uVar11) {
                  p->nowPos64 = p->nowPos64 + (ulong)uVar11;
                  local_154 = p->result;
                  iVar27 = 1;
                  if (local_154 == 0) {
                    if ((p->rc).res != 0) {
                      p->result = 9;
                    }
                    if ((p->matchFinderBase).result != 0) {
                      p->result = 8;
                    }
                    local_154 = p->result;
                    if (local_154 != 0) {
                      p->finished = 1;
                    }
                  }
                }
              }
              else if ((local_f4 <= uVar11 + 0x112c) ||
                      (local_60 <=
                       (p->rc).buf +
                       (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x2000)) {
                iVar27 = 2;
              }
            }
          }
        } while (iVar27 == 0);
        if (iVar27 != 2) {
          return local_154;
        }
      }
      p->nowPos64 = p->nowPos64 + (ulong)(UVar38 - (int)local_110);
      SVar12 = Flush(p,UVar38);
      return SVar12;
    }
  }
  return iVar27;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc* p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize) {
  UInt32 nowPos32, startPos32;
  if (p->inStream != 0) {
    p->matchFinderBase.stream = p->inStream;
    p->matchFinder.Init(p->matchFinderObj);
    p->inStream = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0) {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = p->matchFinder.GetIndexByte(p->matchFinderObj, 0 - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
    for (;;) {
      UInt32 pos, len, posState;

      if (p->fastMode)
        len = GetOptimumFast(p, &pos);
      else
        len = GetOptimum(p, nowPos32, &pos);

#ifdef SHOW_STAT2
      printf("\n pos = %4X,   len = %d   pos = %d", nowPos32, len, pos);
#endif

      posState = nowPos32 & p->pbMask;
      if (len == 1 && pos == (UInt32)-1) {
        Byte curByte;
        CLzmaProb* probs;
        const Byte* data;

        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
        data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
        curByte = *data;
        probs = LIT_PROBS(nowPos32, *(data - 1));
        if (IsCharState(p->state))
          LitEnc_Encode(&p->rc, probs, curByte);
        else
          LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
        p->state = kLiteralNextStates[p->state];
      } else {
        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
        if (pos < LZMA_NUM_REPS) {
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
          if (pos == 0) {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
            RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
          } else {
            UInt32 distance = p->reps[pos];
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
            if (pos == 1)
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
            else {
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
              RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
              if (pos == 3)
                p->reps[3] = p->reps[2];
              p->reps[2] = p->reps[1];
            }
            p->reps[1] = p->reps[0];
            p->reps[0] = distance;
          }
          if (len == 1)
            p->state = kShortRepNextStates[p->state];
          else {
            LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
            p->state = kRepNextStates[p->state];
          }
        } else {
          UInt32 posSlot;
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
          p->state = kMatchNextStates[p->state];
          LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          pos -= LZMA_NUM_REPS;
          GetPosSlot(pos, posSlot);
          RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);

          if (posSlot >= kStartPosModelIndex) {
            UInt32 footerBits = ((posSlot >> 1) - 1);
            UInt32 base = ((2 | (posSlot & 1)) << footerBits);
            UInt32 posReduced = pos - base;

            if (posSlot < kEndPosModelIndex)
              RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
            else {
              RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
              RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
              p->alignPriceCount++;
            }
          }
          p->reps[3] = p->reps[2];
          p->reps[2] = p->reps[1];
          p->reps[1] = p->reps[0];
          p->reps[0] = pos;
          p->matchPriceCount++;
        }
      }
      p->additionalOffset -= len;
      nowPos32 += len;
      if (p->additionalOffset == 0) {
        UInt32 processed;
        if (!p->fastMode) {
          if (p->matchPriceCount >= (1 << 7))
            FillDistancesPrices(p);
          if (p->alignPriceCount >= kAlignTableSize)
            FillAlignPrices(p);
        }
        if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
          break;
        processed = nowPos32 - startPos32;
        if (useLimits) {
          if (processed + kNumOpts + 300 >= maxUnpackSize ||
              RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
            break;
        } else if (processed >= (1 << 15)) {
          p->nowPos64 += nowPos32 - startPos32;
          return CheckErrors(p);
        }
      }
    }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}